

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall
lest::success::success(success *this,text *kind_,location *where_,text *expr_,text *note_)

{
  text tStack_a8;
  text local_88;
  text local_68;
  location local_48;
  
  std::__cxx11::string::string((string *)&local_68,(string *)kind_);
  location::location(&local_48,where_);
  std::__cxx11::string::string((string *)&local_88,(string *)expr_);
  std::__cxx11::string::string((string *)&tStack_a8,(string *)note_);
  message::message(&this->super_message,&local_68,&local_48,&local_88,&tStack_a8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  *(undefined ***)&this->super_message = &PTR__message_001a6c28;
  return;
}

Assistant:

success( text kind_, location where_, text expr_, text note_ = "" )
    : message( kind_, where_, expr_, note_) {}